

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_4,_2>,_tcu::Vector<double,_4>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_4,_2>,_tcu::Vector<double,_4>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  GLuint GVar5;
  long lVar6;
  GLdouble *data;
  Matrix<double,_4,_2> result;
  undefined8 auStack_e8 [8];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98 [2];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  auStack_e8[3] = 0x952538;
  GVar5 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  auStack_e8[4] = 0x3ff0000000000000;
  auStack_e8[5] = 0;
  local_a8 = 0;
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0x3ff00000;
  auStack_e8[6] = 0;
  auStack_e8[7] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_38 = *argument_src;
  uStack_30 = *(undefined8 *)((long)argument_src + 8);
  local_28 = *(undefined4 *)((long)argument_src + 0x10);
  uStack_24 = *(undefined4 *)((long)argument_src + 0x14);
  uStack_20 = *(undefined4 *)((long)argument_src + 0x18);
  uStack_1c = *(undefined4 *)((long)argument_src + 0x1c);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar5);
  local_88 = *puVar1;
  uStack_84 = puVar1[1];
  uStack_80 = puVar1[2];
  uStack_7c = puVar1[3];
  auStack_e8[3] = 0x952592;
  (*(code *)(this->super_binaryBase).super_functionObject.m_p_function)(local_78);
  lVar6 = 4;
  do {
    uVar2 = local_98[lVar6 + 1];
    uVar3 = local_78[lVar6];
    uVar4 = local_78[lVar6 + 1];
    auStack_e8[lVar6] = local_98[lVar6];
    auStack_e8[lVar6 + 1] = uVar2;
    auStack_e8[lVar6 + 4] = uVar3;
    auStack_e8[lVar6 + 5] = uVar4;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 8);
  *(undefined8 *)((long)result_dst + 0x10) = auStack_e8[6];
  *(undefined8 *)((long)result_dst + 0x18) = auStack_e8[7];
  *(undefined8 *)result_dst = auStack_e8[4];
  *(undefined8 *)((long)result_dst + 8) = auStack_e8[5];
  *(ulong *)((long)result_dst + 0x20) = CONCAT44(uStack_a4,local_a8);
  *(ulong *)((long)result_dst + 0x28) = CONCAT44(uStack_9c,uStack_a0);
  *(undefined8 *)((long)result_dst + 0x30) = local_98[0];
  *(undefined8 *)((long)result_dst + 0x38) = local_98[1];
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}